

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O1

int __thiscall GEO::geofile::merge_physical_surfaces(geofile *this,geofile *secondary_file)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  *this_00;
  size_t sVar1;
  iterator iVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  _Self __tmp;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  local_68;
  
  this_00 = &this->physical_surfaces_map;
  sVar1 = (secondary_file->physical_surfaces_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if ((this->physical_surfaces_map)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    if (sVar1 != 0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::operator=(&this_00->_M_t,&(secondary_file->physical_surfaces_map)._M_t);
    }
  }
  else if (sVar1 != 0) {
    p_Var3 = (secondary_file->physical_surfaces_map)._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_left;
    p_Var4 = &(secondary_file->physical_surfaces_map)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var3 != p_Var4) {
      do {
        iVar2 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::find(&this_00->_M_t,(key_type *)(p_Var3 + 1));
        if ((_Rb_tree_header *)iVar2._M_node ==
            &(this->physical_surfaces_map)._M_t._M_impl.super__Rb_tree_header) {
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
          ::pair<std::vector<int,_std::allocator<int>_>_&,_true>
                    (&local_68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var3 + 1),(vector<int,_std::allocator<int>_> *)(p_Var3 + 2));
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
          ::
          _M_insert_unique<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
                      *)this_00,&local_68);
          if (local_68.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_68.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_68.second.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_68.second.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68.first._M_dataplus._M_p != &local_68.first.field_2) {
            operator_delete(local_68.first._M_dataplus._M_p,
                            local_68.first.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          std::vector<int,std::allocator<int>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    ((vector<int,std::allocator<int>> *)(iVar2._M_node + 2),
                     iVar2._M_node[2]._M_parent,*(undefined8 *)(p_Var3 + 2),p_Var3[2]._M_parent);
        }
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != p_Var4);
    }
  }
  return 0;
}

Assistant:

int GEO::geofile::merge_physical_surfaces(geofile &secondary_file)
{
    if (!physical_surfaces_map.empty())
    {
        if(!secondary_file.physical_surfaces_map.empty())
        {
            for (auto i = secondary_file.physical_surfaces_map.begin();
                 i != secondary_file.physical_surfaces_map.end(); i++)
            {
                auto j = physical_surfaces_map.find(i->first);
                auto j_end = physical_surfaces_map.end();
                // Physical name already exists in first map.
                // Append to element.
                if (j!=j_end)
                {
                    j->second.insert(j->second.end(),i->second.begin(), i->second.end());
                }
                // Physical name not in first map
                // Append physical name to first map.
                else
                {
                    physical_surfaces_map.insert({i->first,i->second});
                }
            }
        }
    }
    else
    {
        if (!secondary_file.physical_surfaces_map.empty())
            physical_surfaces_map = secondary_file.physical_surfaces_map;
    }
    return EXIT_SUCCESS;
}